

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  long lVar2;
  uchar *addr;
  size_type length;
  size_t max_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_140 [8];
  string _err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [7];
  bool ret;
  int local_f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  undefined1 local_d0 [8];
  string _err;
  undefined1 local_b0 [8];
  MMapFileHandle handle;
  string base_dir;
  undefined1 local_58 [8];
  string filepath;
  USDLoadOptions *options_local;
  string *err_local;
  string *warn_local;
  Stage *stage_local;
  string *_filename_local;
  
  io::ExpandFilePath((string *)local_58,(string *)_filename,(void *)0x0);
  io::GetBaseDir((string *)&handle.size,(string *)_filename);
  bVar1 = io::IsMMapSupported();
  if (bVar1) {
    io::MMapFileHandle::MMapFileHandle((MMapFileHandle *)local_b0);
    ::std::__cxx11::string::string((string *)local_d0);
    bVar1 = io::MMapFile((string *)local_58,(MMapFileHandle *)local_b0,false,(string *)local_d0);
    if (bVar1) {
      lVar2 = ::std::__cxx11::string::size();
      if ((lVar2 != 0) && (warn != (string *)0x0)) {
        ::std::operator+(local_118,local_d0);
        ::std::__cxx11::string::operator+=((string *)warn,(string *)local_118);
        ::std::__cxx11::string::~string((string *)local_118);
      }
      local_f4 = 0;
    }
    else {
      if (err != (string *)0x0) {
        ::std::operator+(local_f0,local_d0);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_f0);
        ::std::__cxx11::string::~string((string *)local_f0);
      }
      _filename_local._7_1_ = 0;
      local_f4 = 1;
    }
    ::std::__cxx11::string::~string((string *)local_d0);
    if (local_f4 == 0) {
      _filename_local._7_1_ =
           LoadUSDFromMemory((uint8_t *)handle._32_8_,(size_t)handle.addr,(string *)local_58,stage,
                             warn,err,options);
      ::std::__cxx11::string::string((string *)local_140);
      io::UnmapFile((MMapFileHandle *)local_b0,(string *)local_140);
      lVar2 = ::std::__cxx11::string::size();
      if ((lVar2 != 0) && (warn != (string *)0x0)) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_140);
        ::std::__cxx11::string::operator+=
                  ((string *)warn,
                   (string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      ::std::__cxx11::string::~string((string *)local_140);
      local_f4 = 1;
    }
    io::MMapFileHandle::~MMapFileHandle((MMapFileHandle *)local_b0);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes,
                              (string *)err,(string *)local_58,
                              (long)options->max_memory_limit_in_mb << 0x14,(void *)0x0);
    if (bVar1) {
      addr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
      length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
      _filename_local._7_1_ =
           LoadUSDFromMemory(addr,length,(string *)&handle.size,stage,warn,err,options);
    }
    else {
      _filename_local._7_1_ = false;
    }
    local_f4 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
  }
  ::std::__cxx11::string::~string((string *)&handle.size);
  ::std::__cxx11::string::~string((string *)local_58);
  return (bool)(_filename_local._7_1_ & 1);
}

Assistant:

bool LoadUSDFromFile(const std::string &_filename, Stage *stage,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;
  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      return false;
    }

    return LoadUSDFromMemory(data.data(), data.size(), base_dir, stage, warn, err,
                             options);
  }
}